

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

int __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::init
          (SparseTextureClampLookupColorTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int *piVar3;
  pointer extraout_RAX;
  pointer pcVar4;
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  *this_01;
  iterator iVar5;
  undefined1 local_310 [32];
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2d0;
  undefined1 local_2a0 [32];
  _Alloc_hider local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_260;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTextureClampLookupResidencyTestCase).
             super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
             super_SparseTextureCommitmentTestCase.mSupportedTargets;
  local_2a0._0_4_ = 0xde0;
  iVar5._M_current =
       *(pointer *)
        ((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mSupportedTargets.
                super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  piVar3 = *(pointer *)
            ((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
                    super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                    super_SparseTextureCommitmentTestCase.mSupportedTargets.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10);
  if (iVar5._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar5,(int *)local_2a0);
    iVar5._M_current =
         *(pointer *)
          ((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
                  super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                  super_SparseTextureCommitmentTestCase.mSupportedTargets.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    piVar3 = *(pointer *)
              ((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.mSupportedTargets.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10);
  }
  else {
    *iVar5._M_current = 0xde0;
    iVar5._M_current = iVar5._M_current + 1;
    *(int **)((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
                     super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                     super_SparseTextureCommitmentTestCase.mSupportedTargets.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) = iVar5._M_current;
  }
  local_2a0._0_4_ = 0x8c18;
  if (iVar5._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar5,(int *)local_2a0);
  }
  else {
    *iVar5._M_current = 0x8c18;
    *(int **)((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
                     super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                     super_SparseTextureCommitmentTestCase.mSupportedTargets.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
         iVar5._M_current + 1;
  }
  local_2a0._0_4_ = 0x81a5;
  iVar5._M_current =
       *(pointer *)
        ((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  if (iVar5._M_current ==
      *(pointer *)
       ((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
               super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10)) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mSupportedInternalFormats,iVar5,
               (int *)local_2a0);
  }
  else {
    *iVar5._M_current = 0x81a5;
    *(int **)((long)&(this->super_SparseTextureClampLookupResidencyTestCase).
                     super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                     super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
         iVar5._M_current + 1;
  }
  local_2a0._0_8_ = local_2a0 + 0x10;
  local_2a0._8_8_ = 0;
  local_2a0[0x10] = '\0';
  local_280._M_p = (pointer)&local_270;
  local_278 = 0;
  local_270._M_local_buf[0] = '\0';
  p_Var2 = &local_260._M_impl.super__Rb_tree_header;
  local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_260._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_260._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sparseTextureClampARB","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,", <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_310,&local_50,&local_70);
  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_310);
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_260);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
    local_260._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_260._M_impl.super__Rb_tree_header._M_header._M_left =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_260._M_impl.super__Rb_tree_header._M_node_count =
         local_2d0._M_impl.super__Rb_tree_header._M_node_count;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_p != &local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_310 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_),local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_310._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  this_01 = &(this->super_SparseTextureClampLookupResidencyTestCase).
             super_SparseTexture2LookupTestCase.mFunctions;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_2a0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"textureClampARB","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,", <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_310,&local_90,&local_b0);
  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_310);
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_260);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
    local_260._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_260._M_impl.super__Rb_tree_header._M_header._M_left =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_260._M_impl.super__Rb_tree_header._M_node_count =
         local_2d0._M_impl.super__Rb_tree_header._M_node_count;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_p != &local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_310 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_),local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_310._0_4_ = 0xde0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c18;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_2a0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"sparseTextureOffsetClampARB","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_310,&local_d0,&local_f0);
  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_310);
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_260);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
    local_260._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_260._M_impl.super__Rb_tree_header._M_header._M_left =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_260._M_impl.super__Rb_tree_header._M_node_count =
         local_2d0._M_impl.super__Rb_tree_header._M_node_count;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_p != &local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_310 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_),local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_310._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_2a0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"textureOffsetClampARB","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_310,&local_110,&local_130);
  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_310);
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_260);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
    local_260._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_260._M_impl.super__Rb_tree_header._M_header._M_left =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_260._M_impl.super__Rb_tree_header._M_node_count =
         local_2d0._M_impl.super__Rb_tree_header._M_node_count;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_p != &local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_310 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_),local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_310._0_4_ = 0xde0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c18;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_2a0);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"sparseTextureGradClampARB","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_310,&local_150,&local_170);
  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_310);
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_260);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
    local_260._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_260._M_impl.super__Rb_tree_header._M_header._M_left =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_260._M_impl.super__Rb_tree_header._M_node_count =
         local_2d0._M_impl.super__Rb_tree_header._M_node_count;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_p != &local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_310 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_),local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_310._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_2a0);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"textureGradClampARB","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_310,&local_190,&local_1b0);
  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_310);
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_260);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
    local_260._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_260._M_impl.super__Rb_tree_header._M_header._M_left =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_260._M_impl.super__Rb_tree_header._M_node_count =
         local_2d0._M_impl.super__Rb_tree_header._M_node_count;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_p != &local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_310 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_),local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_310._0_4_ = 0xde0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c18;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_2a0);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"sparseTextureGradOffsetClampARB","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,"");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_310,&local_1d0,&local_1f0);
  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_310);
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_260);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
    local_260._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_260._M_impl.super__Rb_tree_header._M_header._M_left =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_260._M_impl.super__Rb_tree_header._M_node_count =
         local_2d0._M_impl.super__Rb_tree_header._M_node_count;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_p != &local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_310 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_),local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_310._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_2a0);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"textureGradOffsetClampARB","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,"");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_310,&local_210,&local_230);
  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_310);
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_260);
  if (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
    local_260._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_260._M_impl.super__Rb_tree_header._M_header._M_left =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_260._M_impl.super__Rb_tree_header._M_node_count =
         local_2d0._M_impl.super__Rb_tree_header._M_node_count;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_p != &local_2e0) {
    operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_310 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_),local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_310._0_4_ = 0xde0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c18;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  local_310._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_260,(int *)local_310);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_2a0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p != &local_270) {
    operator_delete(local_280._M_p,
                    CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]) + 1);
  }
  pcVar4 = local_2a0 + 0x10;
  if ((pointer)local_2a0._0_8_ != pcVar4) {
    operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
    pcVar4 = extraout_RAX;
  }
  return (int)pcVar4;
}

Assistant:

void SparseTextureClampLookupColorTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedTargets.push_back(GL_TEXTURE_1D);
	mSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradClampARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureGradClampARB", ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"sparseTextureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"textureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);
}